

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O3

double MatDet(double *A,int row)

{
  undefined1 auVar1 [16];
  int *list;
  long lVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  list = (int *)malloc((long)row * 4);
  auVar1 = _DAT_001086b0;
  if (0 < row) {
    lVar2 = (ulong)(uint)row - 1;
    auVar5._8_4_ = (int)lVar2;
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = (int)((ulong)lVar2 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_001086b0;
    auVar6 = _DAT_001086a0;
    do {
      auVar7 = auVar6 ^ auVar1;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        list[uVar3] = (int)uVar3;
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        list[uVar3 + 1] = (int)uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar2 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar2 + 2;
    } while ((row + 1U & 0xfffffffe) != uVar3);
  }
  dVar4 = det(A,row,0,list,0.0);
  free(list);
  return dVar4;
}

Assistant:

double MatDet(double *A, int row) {
    int *list = (int *) malloc(sizeof(int) * row);
    for (int i = 0; i < row; i++)
        list[i] = i;
    double Out = det(A, row, 0, list, 0.0);
    free(list);
    return Out;
}